

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

type __thiscall
nonstd::optional_lite::optional<tinyusdz::Token>::operator=
          (optional<tinyusdz::Token> *this,optional<tinyusdz::Token> *other)

{
  bool bVar1;
  value_type *pvVar2;
  value_type *this_00;
  optional<tinyusdz::Token> *other_local;
  optional<tinyusdz::Token> *this_local;
  
  bVar1 = has_value(this);
  if ((!bVar1) || (bVar1 = has_value(other), bVar1)) {
    bVar1 = has_value(this);
    if ((bVar1) || (bVar1 = has_value(other), !bVar1)) {
      bVar1 = has_value(this);
      if ((bVar1) && (bVar1 = has_value(other), bVar1)) {
        pvVar2 = operator*(other);
        this_00 = detail::storage_t<tinyusdz::Token>::value
                            ((storage_t<tinyusdz::Token> *)&this->contained);
        tinyusdz::Token::operator=(this_00,pvVar2);
      }
    }
    else {
      pvVar2 = operator*(other);
      initialize<tinyusdz::Token>(this,pvVar2);
    }
  }
  else {
    reset(this);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }